

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
* __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::make_scoped_deallocator
          (scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
           *__return_storage_ptr__,
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
          *this,char **buffer,size_t *buffer_size)

{
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
  *local_40;
  char **local_38;
  size_t *local_30;
  size_t *local_28;
  size_t *buffer_size_local;
  char **buffer_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
  *this_local;
  
  local_40 = this;
  local_38 = buffer;
  local_30 = buffer_size;
  local_28 = buffer_size;
  buffer_size_local = (size_t *)buffer;
  buffer_local = (char **)this;
  this_local = (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
                *)__return_storage_ptr__;
  make_scope_guard<iffl::flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::allocator<_FLAT_FORWARD_LIST_TEST>>::make_scoped_deallocator(char**,unsigned_long*)::_lambda()_1_>
            (__return_storage_ptr__,(iffl *)&local_40,(anon_class_24_3_566c83a5_conflict *)buffer);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] auto make_scoped_deallocator(char **buffer, size_t *buffer_size) noexcept {
        return make_scope_guard([this, buffer, buffer_size]() {
            if (*buffer) {
                deallocate_buffer(*buffer, *buffer_size);
                *buffer = nullptr;
                *buffer_size = 0;
            }
        });
    }